

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void P_FreeLevelData(void)

{
  extsector_t *peVar1;
  long lVar2;
  FMiniBSP *this;
  polyblock_t *ppVar3;
  DInterpolation *pDVar4;
  FPolyObj *pFVar5;
  FPolyObj *pFVar6;
  extsector_t *this_00;
  FPolyObj *this_01;
  polyblock_t *next;
  polyblock_t *link;
  int i_1;
  int i;
  
  FInterpolator::ClearInterpolations(&interpolator);
  (*Renderer->_vptr_FRenderer[0x17])();
  FPolyObj::ClearAllSubsectorLinks();
  SN_StopAllSequences();
  DThinker::DestroyAllThinkers();
  P_ClearPortals();
  FTagManager::Clear(&tagManager);
  wminfo.maxfrags = 0;
  level.found_secrets = 0;
  level.found_items = 0;
  level.killed_monsters = 0;
  level.total_secrets = 0;
  level.total_items = 0;
  level.total_monsters = 0;
  FBehavior::StaticUnloadModules();
  if (vertexes != (vertex_t *)0x0) {
    if (vertexes != (vertex_t *)0x0) {
      operator_delete__(vertexes);
    }
    vertexes = (vertex_t *)0x0;
  }
  numvertexes = 0;
  if (segs != (seg_t *)0x0) {
    if (segs != (seg_t *)0x0) {
      operator_delete__(segs);
    }
    segs = (seg_t *)0x0;
  }
  numsegs = 0;
  if (glsegextras != (glsegextra_t *)0x0) {
    if (glsegextras != (glsegextra_t *)0x0) {
      operator_delete__(glsegextras);
    }
    glsegextras = (glsegextra_t *)0x0;
  }
  if (sectors != (sector_t *)0x0) {
    peVar1 = sectors->e;
    if (peVar1 != (extsector_t *)0x0) {
      lVar2 = *(long *)&peVar1[-1].vertices.Most;
      this_00 = peVar1 + lVar2;
      while (peVar1 != this_00) {
        this_00 = this_00 + -1;
        extsector_t::~extsector_t(this_00);
      }
      operator_delete__(&peVar1[-1].vertices.Most,lVar2 * 0xb0 + 8);
    }
    if (sectors != (sector_t *)0x0) {
      operator_delete__(sectors);
    }
    sectors = (sector_t *)0x0;
  }
  numsectors = 0;
  if (((gamenodes != (node_t *)0x0) && (gamenodes != nodes)) && (gamenodes != (node_t *)0x0)) {
    operator_delete__(gamenodes);
  }
  if (((gamesubsectors != (subsector_t *)0x0) && (gamesubsectors != subsectors)) &&
     (gamesubsectors != (subsector_t *)0x0)) {
    operator_delete__(gamesubsectors);
  }
  if (subsectors != (subsector_t *)0x0) {
    for (link._4_4_ = 0; link._4_4_ < numsubsectors; link._4_4_ = link._4_4_ + 1) {
      if ((subsectors[link._4_4_].BSP != (FMiniBSP *)0x0) &&
         (this = subsectors[link._4_4_].BSP, this != (FMiniBSP *)0x0)) {
        FMiniBSP::~FMiniBSP(this);
        operator_delete(this,0x48);
      }
    }
    if (subsectors != (subsector_t *)0x0) {
      operator_delete__(subsectors);
    }
  }
  if ((nodes != (node_t *)0x0) && (nodes != (node_t *)0x0)) {
    operator_delete__(nodes);
  }
  gamesubsectors = (subsector_t *)0x0;
  subsectors = (subsector_t *)0x0;
  numgamesubsectors = 0;
  numsubsectors = 0;
  gamenodes = (node_t *)0x0;
  nodes = (node_t *)0x0;
  numgamenodes = 0;
  numnodes = 0;
  if (lines != (line_t *)0x0) {
    if (lines != (line_t *)0x0) {
      operator_delete__(lines);
    }
    lines = (line_t *)0x0;
  }
  numlines = 0;
  if (sides != (side_t *)0x0) {
    if (sides != (side_t *)0x0) {
      operator_delete__(sides);
    }
    sides = (side_t *)0x0;
  }
  numsides = 0;
  if (blockmaplump != (int *)0x0) {
    if (blockmaplump != (int *)0x0) {
      operator_delete__(blockmaplump);
    }
    blockmaplump = (int *)0x0;
  }
  if (blocklinks != (FBlockNode **)0x0) {
    if (blocklinks != (FBlockNode **)0x0) {
      operator_delete__(blocklinks);
    }
    blocklinks = (FBlockNode **)0x0;
  }
  if (PolyBlockMap != (polyblock_t **)0x0) {
    link._0_4_ = bmapwidth * bmapheight;
    while (link._0_4_ = (int)link + -1, -1 < (int)link) {
      ppVar3 = PolyBlockMap[(int)link];
      while (next = ppVar3, next != (polyblock_t *)0x0) {
        ppVar3 = next->next;
        if (next != (polyblock_t *)0x0) {
          operator_delete(next,0x18);
        }
      }
    }
    if (PolyBlockMap != (polyblock_t **)0x0) {
      operator_delete__(PolyBlockMap);
    }
    PolyBlockMap = (polyblock_t **)0x0;
  }
  if (rejectmatrix != (BYTE *)0x0) {
    if (rejectmatrix != (BYTE *)0x0) {
      operator_delete__(rejectmatrix);
    }
    rejectmatrix = (BYTE *)0x0;
  }
  if (linebuffer != (line_t **)0x0) {
    if (linebuffer != (line_t **)0x0) {
      operator_delete__(linebuffer);
    }
    linebuffer = (line_t **)0x0;
  }
  pFVar6 = polyobjs;
  if (polyobjs != (FPolyObj *)0x0) {
    if (polyobjs != (FPolyObj *)0x0) {
      pFVar5 = polyobjs + -1;
      pDVar4 = polyobjs[-1].interpolation.field_0.p;
      this_01 = polyobjs + (long)pDVar4;
      while (pFVar6 != this_01) {
        this_01 = this_01 + -1;
        FPolyObj::~FPolyObj(this_01);
      }
      operator_delete__(&pFVar5->interpolation,(long)pDVar4 * 0xf0 + 8);
    }
    polyobjs = (FPolyObj *)0x0;
  }
  po_NumPolyobjs = 0;
  if (zones != (zone_t *)0x0) {
    if (zones != (zone_t *)0x0) {
      operator_delete__(zones);
    }
    zones = (zone_t *)0x0;
  }
  numzones = 0;
  P_FreeStrifeConversations();
  if (level.Scrolls != (FSectorScrollValues *)0x0) {
    if (level.Scrolls != (FSectorScrollValues *)0x0) {
      operator_delete__(level.Scrolls);
    }
    level.Scrolls = (FSectorScrollValues *)0x0;
  }
  P_ClearUDMFKeys();
  return;
}

Assistant:

void P_FreeLevelData ()
{
	interpolator.ClearInterpolations();	// [RH] Nothing to interpolate on a fresh level.
	Renderer->CleanLevelData();
	FPolyObj::ClearAllSubsectorLinks(); // can't be done as part of the polyobj deletion process.
	SN_StopAllSequences ();
	DThinker::DestroyAllThinkers ();
	P_ClearPortals();
	tagManager.Clear();
	level.total_monsters = level.total_items = level.total_secrets =
		level.killed_monsters = level.found_items = level.found_secrets =
		wminfo.maxfrags = 0;
		
	FBehavior::StaticUnloadModules ();
	if (vertexes != NULL)
	{
		delete[] vertexes;
		vertexes = NULL;
	}
	numvertexes = 0;
	if (segs != NULL)
	{
		delete[] segs;
		segs = NULL;
	}
	numsegs = 0;
	if (glsegextras != NULL)
	{
		delete[] glsegextras;
		glsegextras = NULL;
	}
	if (sectors != NULL)
	{
		delete[] sectors[0].e;
		delete[] sectors;
		sectors = NULL;
	}
	numsectors = 0;
	if (gamenodes != NULL && gamenodes != nodes)
	{
		delete[] gamenodes;
	}
	if (gamesubsectors != NULL && gamesubsectors != subsectors)
	{
		delete[] gamesubsectors;
	}
	if (subsectors != NULL)
	{
		for (int i = 0; i < numsubsectors; ++i)
		{
			if (subsectors[i].BSP != NULL)
			{
				delete subsectors[i].BSP;
			}
		}
		delete[] subsectors;
	}
	if (nodes != NULL)
	{
		delete[] nodes;
	}
	subsectors = gamesubsectors = NULL;
	numsubsectors = numgamesubsectors = 0;
	nodes = gamenodes = NULL;
	numnodes = numgamenodes = 0;
	if (lines != NULL)
	{
		delete[] lines;
		lines = NULL;
	}
	numlines = 0;
	if (sides != NULL)
	{
		delete[] sides;
		sides = NULL;
	}
	numsides = 0;

	if (blockmaplump != NULL)
	{
		delete[] blockmaplump;
		blockmaplump = NULL;
	}
	if (blocklinks != NULL)
	{
		delete[] blocklinks;
		blocklinks = NULL;
	}
	if (PolyBlockMap != NULL)
	{
		for (int i = bmapwidth*bmapheight-1; i >= 0; --i)
		{
			polyblock_t *link = PolyBlockMap[i];
			while (link != NULL)
			{
				polyblock_t *next = link->next;
				delete link;
				link = next;
			}
		}
		delete[] PolyBlockMap;
		PolyBlockMap = NULL;
	}
	if (rejectmatrix != NULL)
	{
		delete[] rejectmatrix;
		rejectmatrix = NULL;
	}
	if (linebuffer != NULL)
	{
		delete[] linebuffer;
		linebuffer = NULL;
	}
	if (polyobjs != NULL)
	{
		delete[] polyobjs;
		polyobjs = NULL;
	}
	po_NumPolyobjs = 0;
	if (zones != NULL)
	{
		delete[] zones;
		zones = NULL;
	}
	numzones = 0;
	P_FreeStrifeConversations ();
	if (level.Scrolls != NULL)
	{
		delete[] level.Scrolls;
		level.Scrolls = NULL;
	}
	P_ClearUDMFKeys();
}